

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O0

int __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::remove
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  int iVar1;
  DLPSV *pDVar2;
  DLPSV *pDVar3;
  DLPSV **ppDVar4;
  DLPSV *in_stack_ffffffffffffffd8;
  
  pDVar2 = first(this);
  if ((DLPSV *)__filename == pDVar2) {
    pDVar2 = next(this,in_stack_ffffffffffffffd8);
    (((DLPSV *)this)->super_SVectorBase<double>).m_elem = (Nonzero<double> *)pDVar2;
    pDVar2 = first(this);
    if (pDVar2 == (DLPSV *)0x0) {
      (((DLPSV *)this)->super_SVectorBase<double>).memsize = 0;
      (((DLPSV *)this)->super_SVectorBase<double>).memused = 0;
      pDVar2 = (DLPSV *)this;
    }
    iVar1 = (int)pDVar2;
  }
  else {
    pDVar2 = (DLPSV *)__filename;
    pDVar3 = last(this);
    if (pDVar2 == pDVar3) {
      ppDVar4 = SVSetBase<double>::DLPSV::prev((DLPSV *)__filename);
      *(DLPSV **)&(((DLPSV *)this)->super_SVectorBase<double>).memsize = *ppDVar4;
    }
    else {
      ppDVar4 = SVSetBase<double>::DLPSV::prev((DLPSV *)__filename);
      pDVar2 = *ppDVar4;
      ppDVar4 = SVSetBase<double>::DLPSV::next((DLPSV *)__filename);
      ppDVar4 = SVSetBase<double>::DLPSV::prev(*ppDVar4);
      *ppDVar4 = pDVar2;
      ppDVar4 = SVSetBase<double>::DLPSV::next((DLPSV *)__filename);
      pDVar2 = *ppDVar4;
      ppDVar4 = SVSetBase<double>::DLPSV::prev((DLPSV *)__filename);
      this = (IdList<soplex::SVSetBase<double>::DLPSV> *)SVSetBase<double>::DLPSV::next(*ppDVar4);
      (((DLPSV *)this)->super_SVectorBase<double>).m_elem = (Nonzero<double> *)pDVar2;
    }
    iVar1 = (int)this;
  }
  return iVar1;
}

Assistant:

void remove(T* elem)
   {
      if(elem == first())
      {
         this->the_first = next(elem);

         if(first() == nullptr)
            this->the_last = nullptr;
      }
      else if(elem == last())
         this->the_last = elem->prev();
      else
      {
         elem->next()->prev() = elem->prev();
         elem->prev()->next() = elem->next();
      }
   }